

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ai.cxx
# Opt level: O2

void __thiscall write_node_v10::operator()(write_node_v10 *this,ai_node *node,xr_writer *w)

{
  uint16_t local_24;
  uint16_t local_22;
  uint16_t local_20;
  uint16_t local_1e;
  uint32_t local_1c;
  
  (*w->_vptr_xr_writer[2])(w,node,0xc);
  local_24 = node->cover;
  (*w->_vptr_xr_writer[2])(w,&local_24,2);
  local_22 = node->low_cover;
  (*w->_vptr_xr_writer[2])(w,&local_22,2);
  local_20 = node->plane;
  (*w->_vptr_xr_writer[2])(w,&local_20,2);
  local_1c = node->packed_xz;
  (*w->_vptr_xr_writer[2])(w,&local_1c,3);
  local_1e = node->packed_y;
  (*w->_vptr_xr_writer[2])(w,&local_1e,2);
  return;
}

Assistant:

void operator()(const ai_node& node, xr_writer& w) const {
	w.w_cseq(12, node.data);
	w.w_u16(node.cover);
	w.w_u16(node.low_cover);
	w.w_u16(node.plane);
	w.w_u24(node.packed_xz);
	w.w_u16(node.packed_y);
}